

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall
ClipperLib::Clipper::AddIntersectNode(Clipper *this,TEdge *e1,TEdge *e2,IntPoint *pt)

{
  long64 lVar1;
  bool bVar2;
  IntersectNode *node1;
  IntersectNode **ppIVar3;
  IntersectNode *node2;
  
  node1 = (IntersectNode *)operator_new(0x28);
  node1->edge1 = e1;
  node1->edge2 = e2;
  lVar1 = pt->Y;
  (node1->pt).X = pt->X;
  (node1->pt).Y = lVar1;
  node1->next = (IntersectNode *)0x0;
  node2 = this->m_IntersectNodes;
  ppIVar3 = &this->m_IntersectNodes;
  if (node2 != (IntersectNode *)0x0) {
    bVar2 = ProcessParam1BeforeParam2(node1,node2);
    if (!bVar2) {
      do {
        node2 = (*ppIVar3)->next;
        ppIVar3 = &(*ppIVar3)->next;
        if (node2 == (IntersectNode *)0x0) break;
        bVar2 = ProcessParam1BeforeParam2(node2,node1);
      } while (bVar2);
    }
    node1->next = node2;
  }
  *ppIVar3 = node1;
  return;
}

Assistant:

void Clipper::AddIntersectNode(TEdge *e1, TEdge *e2, const IntPoint &pt)
{
  IntersectNode* newNode = new IntersectNode;
  newNode->edge1 = e1;
  newNode->edge2 = e2;
  newNode->pt = pt;
  newNode->next = 0;
  if( !m_IntersectNodes ) m_IntersectNodes = newNode;
  else if(  ProcessParam1BeforeParam2(*newNode, *m_IntersectNodes) )
  {
    newNode->next = m_IntersectNodes;
    m_IntersectNodes = newNode;
  }
  else
  {
    IntersectNode* iNode = m_IntersectNodes;
    while( iNode->next  && ProcessParam1BeforeParam2(*iNode->next, *newNode) )
        iNode = iNode->next;
    newNode->next = iNode->next;
    iNode->next = newNode;
  }
}